

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_subsample_lbd_422_32x16_ssse3(uint8_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  int in_stack_00000058;
  int in_stack_0000005c;
  uint16_t *in_stack_00000060;
  int in_stack_0000006c;
  uint8_t *in_stack_00000070;
  
  cfl_luma_subsampling_422_lbd_ssse3
            (in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_0000005c,
             in_stack_00000058);
  return;
}

Assistant:

CFL_GET_SUBSAMPLE_FUNCTION(ssse3)

static inline __m128i predict_unclipped(const __m128i *input, __m128i alpha_q12,
                                        __m128i alpha_sign, __m128i dc_q0) {
  __m128i ac_q3 = _mm_loadu_si128(input);
  __m128i ac_sign = _mm_sign_epi16(alpha_sign, ac_q3);
  __m128i scaled_luma_q0 = _mm_mulhrs_epi16(_mm_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm_add_epi16(scaled_luma_q0, dc_q0);
}